

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->sat).sum.extent.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->sat).sum.extent.pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->sat).sum.allocator.memoryResource = alloc.memoryResource;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0,8);
  (this->sat).sum.values = (double *)CONCAT44(extraout_var,iVar1);
  (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->func).allocator.memoryResource = alloc.memoryResource;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0,4);
  (this->func).values = (float *)CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Allocator alloc) : sat(alloc), func(alloc) {}